

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall
helics::apps::Connector::loadJsonFile
          (Connector *this,string *jsonString,bool enableFederateInterfaceRegistration)

{
  bool bVar1;
  undefined1 uVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  byte in_DL;
  long in_RDI;
  string *in_stack_00000028;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *subElement;
  const_iterator __end4;
  const_iterator __begin4;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *__range4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  connectionObject;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *connectionElement;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  value_type connectionArray;
  value_type *connectorConfig;
  json doc;
  string *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9f;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffdb0;
  allocator<char> *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffdf0;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *this_02;
  undefined1 in_stack_fffffffffffffe3f;
  string *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe48;
  App *in_stack_fffffffffffffe50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe60;
  Connector *in_stack_fffffffffffffe68;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_f0;
  allocator<char> local_d9 [40];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_b1 [2];
  allocator<char> local_89 [33];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_60;
  allocator<char> local_39 [40];
  byte local_11;
  
  local_11 = in_DL & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdd0,
             (char *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
             in_stack_fffffffffffffdc0);
  App::loadJsonFileConfiguration
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
             (bool)in_stack_fffffffffffffe3f);
  std::__cxx11::string::~string(in_stack_fffffffffffffd90);
  std::allocator<char>::~allocator(local_39);
  this_02 = &local_60;
  fileops::loadJson(in_stack_00000028);
  bVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[10],_0>
                    (in_stack_fffffffffffffdb0,
                     (char (*) [10])CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
  if (bVar1) {
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                          (char *)in_stack_fffffffffffffdd8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdd0,
               (char *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
               in_stack_fffffffffffffdc0);
    bVar1 = fileops::getOrDefault((json *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,false)
    ;
    *(bool *)(in_RDI + 0x1b8) = bVar1;
    std::__cxx11::string::~string(in_stack_fffffffffffffd90);
    std::allocator<char>::~allocator(local_89);
    in_stack_fffffffffffffdf0 = local_b1;
    in_stack_fffffffffffffde8 = local_68;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdd0,
               (char *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
               in_stack_fffffffffffffdc0);
    in_stack_fffffffffffffde7 =
         fileops::getOrDefault((json *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,false);
    *(undefined1 *)(in_RDI + 0x1b9) = in_stack_fffffffffffffde7;
    std::__cxx11::string::~string(in_stack_fffffffffffffd90);
    std::allocator<char>::~allocator((allocator<char> *)local_b1);
    in_stack_fffffffffffffdd8 = local_d9;
    this_01 = local_68;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
               in_stack_fffffffffffffdc0);
    bVar1 = fileops::getOrDefault((json *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,false)
    ;
    *(bool *)(in_RDI + 0x1ba) = bVar1;
    std::__cxx11::string::~string(in_stack_fffffffffffffd90);
    std::allocator<char>::~allocator(local_d9);
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
             (char *)in_stack_fffffffffffffdd8);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json(in_stack_fffffffffffffdf0,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)in_stack_fffffffffffffde8);
  bVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::is_array(&local_f0);
  if (bVar1) {
    CLI::std::
    unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
    ::size((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
            *)0x1efef0);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::size((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98));
    CLI::std::
    unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
    ::reserve((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
               *)in_stack_fffffffffffffd90,(size_type)in_stack_fffffffffffffd88);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98));
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98));
    while (bVar1 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)in_stack_fffffffffffffd90,
                              (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)in_stack_fffffffffffffd88), bVar1) {
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::operator*(this_02);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x1effa6);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)in_stack_fffffffffffffd88);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)in_stack_fffffffffffffd88);
      while (uVar2 = nlohmann::json_abi_v3_11_3::detail::
                     iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                     ::
                     operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                               ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                 *)in_stack_fffffffffffffd90,
                                (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                 *)in_stack_fffffffffffffd88), (bool)uVar2) {
        in_stack_fffffffffffffd90 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             nlohmann::json_abi_v3_11_3::detail::
             iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
             ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)this_02);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        ::get<std::__cxx11::string,std::__cxx11::string>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)CONCAT17(uVar2,in_stack_fffffffffffffd98));
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        std::__cxx11::string::~string(in_stack_fffffffffffffd90);
        nlohmann::json_abi_v3_11_3::detail::
        iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
        ::operator++((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                      *)in_stack_fffffffffffffd90);
      }
      addConnectionVector(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(this_00);
      nlohmann::json_abi_v3_11_3::detail::
      iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
      ::operator++((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                    *)in_stack_fffffffffffffd90);
    }
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_fffffffffffffd90);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_fffffffffffffd90);
  return;
}

Assistant:

void Connector::loadJsonFile(const std::string& jsonString,
                             bool enableFederateInterfaceRegistration)
{
    loadJsonFileConfiguration("connector", jsonString, enableFederateInterfaceRegistration);

    auto doc = fileops::loadJson(jsonString);

    if (doc.contains("connector")) {
        const auto& connectorConfig = doc["connector"];
        matchTargetEndpoints =
            fileops::getOrDefault(connectorConfig, "match_target_endpoints", matchTargetEndpoints);
        matchMultiple = fileops::getOrDefault(connectorConfig, "match_multiple", matchMultiple);
        alwaysCheckRegex =
            fileops::getOrDefault(connectorConfig, "always_check_regex", alwaysCheckRegex);
    }
    auto connectionArray = doc["connections"];
    if (connectionArray.is_array()) {
        connections.reserve(connections.size() + connectionArray.size());
        for (const auto& connectionElement : connectionArray) {
            std::vector<std::string> connectionObject;
            for (const auto& subElement : connectionElement) {
                connectionObject.push_back(subElement.get<std::string>());
            }
            addConnectionVector(connectionObject);
        }
    }
}